

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtree.h
# Opt level: O2

_Bool rtree_read_independent
                (tsdn_t *tsdn,rtree_t *rtree,rtree_ctx_t *rtree_ctx,uintptr_t key,
                rtree_contents_t *r_contents)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  void *pvVar3;
  undefined8 uVar4;
  undefined1 uVar5;
  rtree_leaf_elm_t *prVar6;
  rtree_leaf_elm_t *prVar7;
  void *pvVar8;
  ulong uVar9;
  long lVar10;
  undefined4 local_e;
  undefined2 local_a;
  
  pvVar8 = (void *)(key & 0xffffffffc0000000);
  uVar9 = (ulong)(((uint)(key >> 0x1e) & 0xf) << 4);
  prVar6 = (rtree_leaf_elm_t *)((long)&rtree_ctx->cache[0].leafkey + uVar9);
  pvVar3 = *(void **)((long)&rtree_ctx->cache[0].leafkey + uVar9);
  if (pvVar3 == pvVar8) {
    prVar7 = (rtree_leaf_elm_t *)((ulong)((uint)key >> 9 & 0x1ffff8) + (long)prVar6[1].le_bits.repr)
    ;
  }
  else if ((void *)rtree_ctx->l2_cache[0].leafkey == pvVar8) {
    prVar7 = rtree_ctx->l2_cache[0].leaf;
    rtree_ctx->l2_cache[0].leafkey = (uintptr_t)pvVar3;
    rtree_ctx->l2_cache[0].leaf = (rtree_leaf_elm_t *)prVar6[1].le_bits.repr;
LAB_01f9950c:
    (prVar6->le_bits).repr = pvVar8;
    prVar6[1].le_bits.repr = prVar7;
    prVar7 = (rtree_leaf_elm_t *)
             ((long)&(prVar7->le_bits).repr + (ulong)((uint)key >> 9 & 0x1ffff8));
  }
  else {
    for (lVar10 = 0x118; lVar10 != 0x188; lVar10 = lVar10 + 0x10) {
      if (*(void **)((long)rtree_ctx->cache + lVar10 + -8) == pvVar8) {
        prVar7 = *(rtree_leaf_elm_t **)((long)&rtree_ctx->cache[0].leafkey + lVar10);
        puVar1 = (undefined8 *)((long)rtree_ctx->cache + lVar10 + -0x18);
        uVar4 = puVar1[1];
        puVar2 = (undefined8 *)((long)rtree_ctx->cache + lVar10 + -8);
        *puVar2 = *puVar1;
        puVar2[1] = uVar4;
        *(void **)((long)rtree_ctx->cache + lVar10 + -0x18) = pvVar3;
        *(void **)((long)(rtree_ctx->cache + -1) + lVar10) = prVar6[1].le_bits.repr;
        goto LAB_01f9950c;
      }
    }
    prVar6 = duckdb_je_rtree_leaf_elm_lookup_hard(tsdn,rtree,rtree_ctx,key,false,false);
    prVar7 = prVar6;
  }
  uVar5 = SUB81(prVar6,0);
  if (prVar7 != (rtree_leaf_elm_t *)0x0) {
    pvVar3 = (prVar7->le_bits).repr;
    r_contents->edata = (edata_t *)(((long)pvVar3 << 0x10) >> 0x10 & 0xffffffffffffff80);
    (r_contents->metadata).szind = (uint)(ushort)((ulong)pvVar3 >> 0x30);
    (r_contents->metadata).state =
         (extent_state_t)((ulong)pvVar3 >> 2) & (extent_state_transition|extent_state_retained);
    (r_contents->metadata).is_head = (_Bool)((byte)(((ulong)pvVar3 & 0xffffffff) >> 1) & 1);
    (r_contents->metadata).slab = (_Bool)((byte)pvVar3 & 1);
    *(undefined4 *)&(r_contents->metadata).field_0xa = local_e;
    uVar5 = (undefined1)local_a;
    *(undefined2 *)&r_contents->field_0x16 = local_a;
  }
  return (_Bool)uVar5;
}

Assistant:

static inline bool
rtree_read_independent(tsdn_t *tsdn, rtree_t *rtree, rtree_ctx_t *rtree_ctx,
    uintptr_t key, rtree_contents_t *r_contents) {
	rtree_leaf_elm_t *elm = rtree_leaf_elm_lookup(tsdn, rtree, rtree_ctx,
	    key, /* dependent */ false, /* init_missing */ false);
	if (elm == NULL) {
		return true;
	}
	*r_contents = rtree_leaf_elm_read(tsdn, rtree, elm,
	    /* dependent */ false);
	return false;
}